

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O3

void get_dir_list(wchar_t argc,char **argv)

{
  char cVar1;
  _Bool _Var2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  char *pcVar5;
  BinarySink *bs;
  char *host;
  char *pcVar6;
  char *__s_00;
  undefined4 in_register_0000003c;
  char c;
  stdio_sink ss;
  uchar local_41;
  stdio_sink local_40;
  
  pcVar6 = (char *)CONCAT44(in_register_0000003c,argc);
  pcVar3 = colon(pcVar6);
  if (pcVar3 == (char *)0x0) {
    bump("Local file listing not supported");
  }
  *pcVar3 = '\0';
  __s_00 = ".";
  if (pcVar3[1] != '\0') {
    __s_00 = pcVar3 + 1;
  }
  pcVar3 = strrchr(pcVar6,0x40);
  if (pcVar3 == (char *)0x0) {
    host = pcVar6;
    pcVar3 = (char *)0x0;
  }
  else {
    host = pcVar3 + 1;
    *pcVar3 = '\0';
    pcVar3 = (char *)0x0;
    if (*pcVar6 != '\0') {
      pcVar3 = pcVar6;
    }
  }
  sVar4 = strlen(__s_00);
  __s = (char *)safemalloc(sVar4 * 4 + 100,1,0);
  builtin_strncpy(__s,"ls -la \'",9);
  sVar4 = strlen(__s);
  pcVar5 = __s + sVar4;
  pcVar6 = __s_00;
  do {
    cVar1 = *pcVar6;
    if (cVar1 == '\'') {
      builtin_strncpy(pcVar5,"\'\\\'\'",4);
      pcVar5 = pcVar5 + 4;
    }
    else {
      if (cVar1 == '\0') {
        pcVar5[0] = '\'';
        pcVar5[1] = '\0';
        do_cmd(host,pcVar3,__s);
        safefree(__s);
        if (using_sftp != true) {
          stdio_sink_init(&local_40,_stdout);
          bs = stripctrl_new(local_40.binarysink_,false,L'\0')->binarysink_;
          _Var2 = ssh_scp_recv(&local_41,1);
          if (_Var2) {
            do {
              BinarySink_put_byte(bs,local_41);
              _Var2 = ssh_scp_recv(&local_41,1);
            } while (_Var2);
          }
          stripctrl_free((StripCtrlChars *)bs);
          return;
        }
        scp_sftp_listdir(__s_00);
        return;
      }
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + 1;
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

static void get_dir_list(int argc, char *argv[])
{
    char *wsrc, *host, *user;
    const char *src;
    char *cmd, *p;
    const char *q;
    char c;

    wsrc = argv[0];

    /* Separate host from filename */
    host = wsrc;
    wsrc = colon(wsrc);
    if (wsrc == NULL)
        bump("Local file listing not supported");
    *wsrc++ = '\0';
    /* Substitute "." for empty filename */
    if (*wsrc == '\0')
        src = ".";
    else
        src = wsrc;

    /* Separate username and hostname */
    user = host;
    host = strrchr(host, '@');
    if (host == NULL) {
        host = user;
        user = NULL;
    } else {
        *host++ = '\0';
        if (*user == '\0')
            user = NULL;
    }

    cmd = snewn(4 * strlen(src) + 100, char);
    strcpy(cmd, "ls -la '");
    p = cmd + strlen(cmd);
    for (q = src; *q; q++) {
        if (*q == '\'') {
            *p++ = '\'';
            *p++ = '\\';
            *p++ = '\'';
            *p++ = '\'';
        } else {
            *p++ = *q;
        }
    }
    *p++ = '\'';
    *p = '\0';

    do_cmd(host, user, cmd);
    sfree(cmd);

    if (using_sftp) {
        scp_sftp_listdir(src);
    } else {
        stdio_sink ss;
        stdio_sink_init(&ss, stdout);
        StripCtrlChars *scc = stripctrl_new(
            BinarySink_UPCAST(&ss), false, L'\0');
        while (ssh_scp_recv(&c, 1))
            put_byte(scc, c);
        stripctrl_free(scc);
    }
}